

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_command_mode(EditLine *el,wint_t c)

{
  wint_t c_local;
  EditLine *el_local;
  
  (el->el_chared).c_vcmd.action = L'\0';
  (el->el_chared).c_vcmd.pos = (wchar_t *)0x0;
  (el->el_state).doingarg = L'\0';
  (el->el_state).inputmode = L'\0';
  (el->el_map).current = (el->el_map).alt;
  if ((el->el_line).buffer < (el->el_line).cursor) {
    (el->el_line).cursor = (el->el_line).cursor + -1;
  }
  return '\x05';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_command_mode(EditLine *el, wint_t c __attribute__((__unused__)))
{

	/* [Esc] cancels pending action */
	el->el_chared.c_vcmd.action = NOP;
	el->el_chared.c_vcmd.pos = 0;

	el->el_state.doingarg = 0;

	el->el_state.inputmode = MODE_INSERT;
	el->el_map.current = el->el_map.alt;
#ifdef VI_MOVE
	if (el->el_line.cursor > el->el_line.buffer)
		el->el_line.cursor--;
#endif
	return CC_CURSOR;
}